

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2productAndSetup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  Item *pIVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  Real eps;
  type_conflict5 tVar3;
  bool bVar4;
  ulong uVar5;
  cpp_dec_float<50U,_int,_void> *this_00;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int local_d4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  uVar5 = ((long)(x->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(x->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x38;
  iVar8 = (int)uVar5;
  if (iVar8 == 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
    (x->super_IdxSet).num = 0;
  }
  else {
    uVar7 = 0;
    uVar5 = uVar5 & 0xffffffff;
    if (iVar8 < 1) {
      uVar5 = uVar7;
    }
    local_d4 = 0;
    for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      this_00 = &(x->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7].m_backend;
      local_68.data._M_elems._0_8_ = local_68.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar3 = boost::multiprecision::operator!=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)this_00,(int *)&local_68);
      if (tVar3) {
        local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((this_00->data)._M_elems + 8);
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this_00->data)._M_elems;
        local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((this_00->data)._M_elems + 2);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((this_00->data)._M_elems + 4);
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((this_00->data)._M_elems + 6);
        local_a8.m_backend.exp = this_00->exp;
        local_a8.m_backend.neg = this_00->neg;
        local_a8.m_backend.fpclass = this_00->fpclass;
        local_a8.m_backend.prec_elem = this_00->prec_elem;
        eps = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
        bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_a8,eps);
        if (bVar4) {
          pIVar1 = (A->set).theitem;
          iVar8 = (A->set).thekey[uVar7].idx;
          (x->super_IdxSet).idx[local_d4] = (int)uVar7;
          uVar6 = (ulong)(uint)pIVar1[iVar8].data.
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .memused;
          lVar9 = uVar6 * 0x3c;
          while( true ) {
            if ((int)uVar6 < 1) break;
            pNVar2 = pIVar1[iVar8].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_68,this_00,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)&pNVar2[-1].val.m_backend.data + lVar9));
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      ((cpp_dec_float<50U,_int,_void> *)
                       ((long)*(int *)((long)(&pNVar2[-1].val + 1) + lVar9) * 0x38 +
                       *(long *)(this + 0x20)),&local_68);
            uVar6 = (ulong)((int)uVar6 - 1);
            lVar9 = lVar9 + -0x3c;
          }
          local_d4 = local_d4 + 1;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,0);
        }
      }
    }
    (x->super_IdxSet).num = local_d4;
    this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  )0x0;
  }
  x->setupStatus = true;
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productAndSetup(const SVSetBase<S>& A, SSVectorBase<T>& x)
{
   assert(!x.isSetup());

   if(x.dim() == 0)
   {
      // x == 0 => this := zero vector
      clear();
      x.num = 0;
   }
   else
   {
      // x is not setup, so walk through its value vector
      int nzcount = 0;
      int end = x.dim();

      for(int i = 0; i < end; ++i)
      {
         // advance to the next element != 0
         T& xval = x.val[i];

         if(xval != 0)
         {
            // If x[i] is really nonzero, compute A[i] * x[i] and adapt x.idx,
            // otherwise set x[i] to 0.
            if(isNotZero(xval, this->tolerances()->epsilon()))
            {
               const SVectorBase<S>& Ai = A[i];
               x.idx[ nzcount++ ] = i;

               for(int j = Ai.size() - 1; j >= 0; --j)
               {
                  const Nonzero<S>& elt = Ai.element(j);
                  VectorBase<R>::val[elt.idx] += xval * elt.val;
               }
            }
            else
               xval = 0;
         }
      }

      x.num = nzcount;
      setupStatus = false;
   }

   x.setupStatus = true;

   assert(isConsistent());

   return *this;
}